

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QByteArray,_QByteArray>_>::insert
          (QMovableArrayOps<std::pair<QByteArray,_QByteArray>_> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  pair<QByteArray,_QByteArray> **pppVar1;
  qsizetype *pqVar2;
  QArrayData *pQVar3;
  char *pcVar4;
  qsizetype qVar5;
  QArrayData *pQVar6;
  char *pcVar7;
  qsizetype qVar8;
  long lVar9;
  pair<QByteArray,_QByteArray> *ppVar10;
  qsizetype inserts;
  bool bVar11;
  
  pQVar3 = &((t->first).d.d)->super_QArrayData;
  pcVar4 = (t->first).d.ptr;
  qVar5 = (t->first).d.size;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar6 = &((t->second).d.d)->super_QArrayData;
  pcVar7 = (t->second).d.ptr;
  qVar8 = (t->second).d.size;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar11 = (this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
           super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.size != 0;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this,(uint)(i == 0 && bVar11),
             n,(pair<QByteArray,_QByteArray> **)0x0,
             (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0);
  if (i == 0 && bVar11) {
    if (n != 0) {
      do {
        ppVar10 = (this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
                  super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.ptr;
        ppVar10[-1].first.d.d = (Data *)pQVar3;
        ppVar10[-1].first.d.ptr = pcVar4;
        ppVar10[-1].first.d.size = qVar5;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        ppVar10[-1].second.d.d = (Data *)pQVar6;
        ppVar10[-1].second.d.ptr = pcVar7;
        ppVar10[-1].second.d.size = qVar8;
        if (pQVar6 != (QArrayData *)0x0) {
          LOCK();
          (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        n = n + -1;
        pppVar1 = &(this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
                   super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.ptr;
        *pppVar1 = *pppVar1 + -1;
        pqVar2 = &(this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
                  super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.size;
        *pqVar2 = *pqVar2 + 1;
      } while (n != 0);
    }
  }
  else {
    ppVar10 = (this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
              super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.ptr + i;
    memmove(ppVar10 + n,ppVar10,
            ((this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
             super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.size - i) * 0x30);
    lVar9 = n;
    if (n != 0) {
      do {
        (ppVar10->first).d.d = (Data *)pQVar3;
        (ppVar10->first).d.ptr = pcVar4;
        (ppVar10->first).d.size = qVar5;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        (ppVar10->second).d.d = (Data *)pQVar6;
        (ppVar10->second).d.ptr = pcVar7;
        (ppVar10->second).d.size = qVar8;
        if (pQVar6 != (QArrayData *)0x0) {
          LOCK();
          (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar9 = lVar9 + -1;
        ppVar10 = ppVar10 + 1;
      } while (lVar9 != 0);
    }
    pqVar2 = &(this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
              super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.size;
    *pqVar2 = *pqVar2 + n;
  }
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,1,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,1,0x10);
      return;
    }
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }